

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void log_code(char *file,int row,int col,char *message,...)

{
  FILE *file_00;
  char in_AL;
  CharBuff *buff;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_108.reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_108.overflow_arg_area = &args[0].overflow_arg_area;
  local_108.gp_offset = 0x20;
  local_108.fp_offset = 0x30;
  local_c8 = in_R8;
  local_c0 = in_R9;
  buff = new_buff(100);
  append_str(buff,file);
  append_str(buff,":");
  pcVar1 = itochr(row);
  append_str(buff,pcVar1);
  append_chr(buff,':');
  pcVar1 = itochr(col);
  append_str(buff,pcVar1);
  append_chr(buff,':');
  append_str(buff,"\x1b[31mERROR\x1b[0m: ");
  append_str(buff,message);
  file_00 = _stderr;
  pcVar1 = to_string(buff);
  log_log(7,file_00,pcVar1,&local_108);
  recycle_buff(buff);
  exit(1);
}

Assistant:

void log_code(char *file, int row, int col, const char *message, ...) {
    va_list args;
    va_start(args,message);
    CharBuff *buff = new_buff(100);
    append_str(buff, file);
    append_str(buff, ":");
    append_str(buff, itochr(row));
    append_chr(buff, ':');
    append_str(buff, itochr(col));
    append_chr(buff, ':');
    append_str(buff, TAG_ERROR);
    append_str(buff, message);
    log_log(LOG_LEVEL_ERROR, stderr, to_string(buff), args);
    va_end(args);
    recycle_buff(buff);
    exit(1);
}